

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_unix.c
# Opt level: O2

TIFF * TIFFOpenExt(char *name,char *mode,TIFFOpenOptions *opts)

{
  int iVar1;
  TIFF *pTVar2;
  int *piVar3;
  char *pcVar4;
  
  pTVar2 = (TIFF *)0x0;
  iVar1 = _TIFFgetMode(opts,(thandle_t)0x0,mode,"TIFFOpen");
  if (iVar1 != -1) {
    iVar1 = open(name,iVar1,0x1b6);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      if ((0 < *piVar3) && (pcVar4 = strerror(*piVar3), pcVar4 != (char *)0x0)) {
        pcVar4 = strerror(*piVar3);
        _TIFFErrorEarly(opts,(thandle_t)0x0,"TIFFOpen","%s: %s",name,pcVar4);
        return (TIFF *)0x0;
      }
      pTVar2 = (TIFF *)0x0;
      _TIFFErrorEarly(opts,(thandle_t)0x0,"TIFFOpen","%s: Cannot open",name);
    }
    else {
      pTVar2 = TIFFFdOpenExt(iVar1,name,mode,opts);
      if (pTVar2 == (TIFF *)0x0) {
        close(iVar1);
        pTVar2 = (TIFF *)0x0;
      }
    }
  }
  return pTVar2;
}

Assistant:

TIFF *TIFFOpenExt(const char *name, const char *mode, TIFFOpenOptions *opts)
{
    static const char module[] = "TIFFOpen";
    int m, fd;
    TIFF *tif;

    m = _TIFFgetMode(opts, NULL, mode, module);
    if (m == -1)
        return ((TIFF *)0);

/* for cygwin and mingw */
#ifdef O_BINARY
    m |= O_BINARY;
#endif

    fd = open(name, m, 0666);
    if (fd < 0)
    {
        if (errno > 0 && strerror(errno) != NULL)
        {
            _TIFFErrorEarly(opts, NULL, module, "%s: %s", name,
                            strerror(errno));
        }
        else
        {
            _TIFFErrorEarly(opts, NULL, module, "%s: Cannot open", name);
        }
        return ((TIFF *)0);
    }

    tif = TIFFFdOpenExt((int)fd, name, mode, opts);
    if (!tif)
        close(fd);
    return tif;
}